

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

ExceptionOr<capnp::AnyPointer::Pipeline> * __thiscall
kj::_::ExceptionOr<capnp::AnyPointer::Pipeline>::operator=
          (ExceptionOr<capnp::AnyPointer::Pipeline> *this,
          ExceptionOr<capnp::AnyPointer::Pipeline> *param_1)

{
  NullableValue<kj::Exception>::operator=
            ((NullableValue<kj::Exception> *)this,(NullableValue<kj::Exception> *)param_1);
  NullableValue<capnp::AnyPointer::Pipeline>::operator=(&(this->value).ptr,&(param_1->value).ptr);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;